

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O3

int ompt_get_num_places(void)

{
  uint uVar1;
  
  uVar1 = 0;
  if (__kmp_affin_mask_size != 0) {
    uVar1 = __kmp_affinity_num_masks;
  }
  return uVar1;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_num_places(void) {
// copied from kmp_ftn_entry.h (but modified)
#if !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  return __kmp_affinity_num_masks;
#endif
}